

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O1

void Am_Destroy_Menu_Bar(Am_Object *object)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object_Demon *pAVar3;
  Am_Object sub_menu;
  Am_Object part;
  Am_Value_List parts;
  Am_Object in_stack_ffffffffffffffa8;
  Am_Object local_50;
  Am_Demon_Set local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Value_List local_30;
  
  Am_Value_List::Am_Value_List(&local_30);
  local_38.data = (Am_Object_Data *)0x0;
  local_40.data = (Am_Object_Data *)0x0;
  pAVar2 = Am_Object::Get(object,0x82,0);
  Am_Value_List::operator=(&local_30,pAVar2);
  Am_Value_List::Start(&local_30);
  while( true ) {
    bVar1 = Am_Value_List::Last(&local_30);
    if (bVar1) break;
    pAVar2 = Am_Value_List::Get(&local_30);
    Am_Object::operator=(&local_38,pAVar2);
    bVar1 = Am_Object::Valid(&local_38);
    if (bVar1) {
      pAVar2 = Am_Object::Get(&local_38,0x1d2,0);
      Am_Object::operator=(&local_40,pAVar2);
      Am_Object::Destroy(&local_40);
    }
    Am_Value_List::Next(&local_30);
  }
  Am_Object_Advanced::Get_Demons((Am_Object_Advanced *)&local_48);
  pAVar3 = Am_Demon_Set::Get_Object_Demon(&local_48,Am_DESTROY_OBJ);
  Am_Demon_Set::~Am_Demon_Set(&local_48);
  if (pAVar3 != (Am_Object_Demon *)0x0) {
    Am_Object::Am_Object(&local_50,object);
    (*pAVar3)(in_stack_ffffffffffffffa8);
    Am_Object::~Am_Object(&local_50);
  }
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_38);
  Am_Value_List::~Am_Value_List(&local_30);
  return;
}

Assistant:

void
Am_Destroy_Menu_Bar(Am_Object object)
{
  Am_Value_List parts;
  Am_Object part;
  Am_Object sub_menu;

  // get all the parts of the given object
  parts = object.Get(Am_GRAPHICAL_PARTS);

  // iterate through the returned list
  for (parts.Start(); !parts.Last(); parts.Next()) {
    // get the current part
    part = parts.Get();

    // is this a valid part?
    if (part.Valid() == true) {
      // get the submenu object and destroy it
      sub_menu = part.Get(Am_SUB_MENU);
      sub_menu.Destroy();
    }
  }

  Am_Object_Demon *proto_demon = ((Am_Object_Advanced &)Am_Menu)
                                     .Get_Demons()
                                     .Get_Object_Demon(Am_DESTROY_OBJ);
  if (proto_demon) {
    proto_demon(object);
  }

  return;
}